

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

TokenType __thiscall Json::Reader::readNumber(Reader *this)

{
  char *pcVar1;
  TokenType TVar2;
  
  pcVar1 = this->current_;
  TVar2 = tokenInteger;
  if (pcVar1 != this->end_) {
    if (*pcVar1 == '-') {
      this->current_ = pcVar1 + 1;
    }
    pcVar1 = this->current_;
    if (pcVar1 != this->end_) {
      do {
        if (9 < (int)*pcVar1 - 0x30U) {
          pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                             (".eE+-","N6jbcoin9STPathSetE");
          if (pcVar1 == "N6jbcoin9STPathSetE") {
            return TVar2;
          }
          TVar2 = tokenDouble;
        }
        pcVar1 = this->current_ + 1;
        this->current_ = pcVar1;
      } while (pcVar1 != this->end_);
    }
  }
  return TVar2;
}

Assistant:

Reader::TokenType
Reader::readNumber ()
{
    static char const extended_tokens[] = { '.', 'e', 'E', '+', '-' };

    TokenType type = tokenInteger;

    if ( current_ != end_ )
    {
        if (*current_ == '-')
            ++current_;

        while ( current_ != end_ )
        {
            if (!std::isdigit (*current_))
            {
                auto ret = std::find (std::begin (extended_tokens),
                    std::end (extended_tokens), *current_);

                if (ret == std::end (extended_tokens))
                    break;

                type = tokenDouble;
            }

            ++current_;
        }
    }

    return type;
}